

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O2

void __thiscall fs_tests::fsbridge_fstream::test_method(fsbridge_fstream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  readonly_property<bool> rVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  string *psVar5;
  iterator pvVar6;
  path *ppVar7;
  long in_FS_OFFSET;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  check_type cVar8;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  string input_buffer;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_318;
  ofstream file;
  path local_100;
  path tmpfile2;
  path local_b0;
  path tmpfile1;
  path tmpfolder;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tmpfile2,anon_var_dwarf_6e376f,(allocator<char> *)&input_buffer);
  fs::u8path((path *)&file,(string *)&tmpfile2);
  fs::operator/(&tmpfile1,(path *)&local_b0,(path *)&file);
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::__cxx11::string::~string((string *)&tmpfile2);
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::path(&local_100,&tmpfolder.super_path);
  std::filesystem::__cxx11::path::path<char8_t[18],std::filesystem::__cxx11::path>
            ((path *)&file,&anon_var_dwarf_6e376f,auto_format);
  fs::operator/(&tmpfile2,(path *)&local_100,(path *)&file);
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::filesystem::__cxx11::path::~path(&local_100);
  std::ofstream::ofstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_out);
  std::operator<<((ostream *)&file,"bitcoin");
  std::ofstream::~ofstream(&file);
  std::ifstream::ifstream(&file,tmpfile2.super_path._M_pathname._M_dataplus._M_p,_S_in);
  paVar1 = &input_buffer.field_2;
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3d;
  file_00.m_begin = (iterator)&local_368;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_378,msg);
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_318._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_318._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_380 = "";
  pvVar4 = (iterator)0x2;
  psVar5 = &input_buffer;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (local_328,&local_388,0x3d,1,2,psVar5,"input_buffer","bitcoin","\"bitcoin\"");
  std::__cxx11::string::~string((string *)&input_buffer);
  std::ifstream::~ifstream(&file);
  std::ifstream::ifstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_in|_S_ate);
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x43;
  file_01.m_begin = (iterator)&local_398;
  msg_00.m_end = (iterator)psVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3a8,
             msg_00);
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_318._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_318._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_3b0 = "";
  pvVar4 = (iterator)0x2;
  psVar5 = &input_buffer;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (local_328,&local_3b8,0x43,1,2,psVar5,"input_buffer","","\"\"");
  std::__cxx11::string::~string((string *)&input_buffer);
  std::ifstream::~ifstream(&file);
  std::ofstream::ofstream(&file,tmpfile2.super_path._M_pathname._M_dataplus._M_p,_S_out|_S_app);
  std::operator<<((ostream *)&file,"tests");
  std::ofstream::~ofstream(&file);
  std::ifstream::ifstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_in);
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4d;
  file_02.m_begin = (iterator)&local_3c8;
  msg_01.m_end = (iterator)psVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3d8,
             msg_01);
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_318._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_318._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_3e0 = "";
  pvVar4 = (iterator)0x2;
  psVar5 = &input_buffer;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (local_328,&local_3e8,0x4d,1,2,psVar5,"input_buffer","bitcointests","\"bitcointests\"");
  std::__cxx11::string::~string((string *)&input_buffer);
  std::ifstream::~ifstream(&file);
  std::ofstream::ofstream(&file,tmpfile2.super_path._M_pathname._M_dataplus._M_p,_S_trunc|_S_out);
  std::operator<<((ostream *)&file,"bitcoin");
  std::ofstream::~ofstream(&file);
  std::ifstream::ifstream(&file,tmpfile1.super_path._M_pathname._M_dataplus._M_p,_S_in);
  input_buffer._M_string_length = 0;
  input_buffer.field_2._M_allocated_capacity =
       input_buffer.field_2._M_allocated_capacity & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)&file,(string *)&input_buffer);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x57;
  file_03.m_begin = (iterator)&local_3f8;
  msg_02.m_end = (iterator)psVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_408,
             msg_02);
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_318._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_318._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_410 = "";
  pvVar4 = (iterator)0x2;
  psVar5 = &input_buffer;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (local_328,&local_418,0x57,1,2,psVar5,"input_buffer","bitcoin","\"bitcoin\"");
  std::__cxx11::string::~string((string *)&input_buffer);
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,anon_var_dwarf_6e376f,(allocator<char> *)&local_448);
  fs::u8path((path *)&input_buffer,(string *)local_328);
  fsbridge::AbsPathJoin((path *)&file,&tmpfolder,(path *)&input_buffer);
  std::filesystem::__cxx11::path::~path((path *)&input_buffer);
  std::__cxx11::string::~string((string *)local_328);
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5c;
  file_04.m_begin = (iterator)&local_428;
  msg_03.m_end = (iterator)psVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_438,
             msg_03);
  _cVar8 = 0x334824;
  rVar3.super_class_property<bool>.value =
       (class_property<bool>)std::filesystem::__cxx11::path::has_root_directory();
  local_328._8_8_ = (element_type *)0x0;
  aStack_318._M_allocated_capacity = 0;
  local_448 = "p.is_absolute()";
  local_440 = "";
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = &local_448;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_450 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_328[0] = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_328,(lazy_ostream *)&input_buffer,1,0,WARN,_cVar8,
             (size_t)&local_458,0x5c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_318._M_allocated_capacity);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5d;
  file_05.m_begin = (iterator)&local_468;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_478,
             msg_04);
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_480 = "";
  pvVar4 = (iterator)0x2;
  ppVar7 = &tmpfile1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&input_buffer,&local_488,0x5d,1,2,ppVar7,"tmpfile1",&file,"p");
  std::filesystem::__cxx11::path::~path((path *)&file);
  fsbridge::AbsPathJoin((path *)&file,&tmpfile1,&tmpfile2);
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x62;
  file_06.m_begin = (iterator)&local_498;
  msg_05.m_end = (iterator)ppVar7;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4a8,
             msg_05);
  _cVar8 = 0x3349b9;
  local_328[0] = (class_property<bool>)std::filesystem::__cxx11::path::has_root_directory();
  local_328._8_8_ = (element_type *)0x0;
  aStack_318._M_allocated_capacity = 0;
  local_448 = "p.is_absolute()";
  local_440 = "";
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = &local_448;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_4b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_328,(lazy_ostream *)&input_buffer,1,0,WARN,_cVar8,
             (size_t)&local_4b8,0x62);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_318._M_allocated_capacity);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x63;
  file_07.m_begin = (iterator)&local_4c8;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4d8,
             msg_06);
  input_buffer._M_string_length = input_buffer._M_string_length & 0xffffffffffffff00;
  input_buffer._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  input_buffer.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  input_buffer.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_4e0 = "";
  pvVar4 = (iterator)0x2;
  ppVar7 = &tmpfile2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&input_buffer,&local_4e8,99,1,2,ppVar7,"tmpfile2",&file,"p");
  std::filesystem::__cxx11::path::~path((path *)&file);
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x67;
  file_08.m_begin = (iterator)&local_4f8;
  msg_07.m_end = (iterator)ppVar7;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_508,
             msg_07);
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_318._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_318._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_510 = "";
  fs::path::path((path *)&input_buffer,"");
  fsbridge::AbsPathJoin((path *)&file,&tmpfile1,(path *)&input_buffer);
  pvVar4 = (iterator)0x2;
  ppVar7 = &tmpfile1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_328,&local_518,0x67,1,2,ppVar7,"tmpfile1",&file,
             "fsbridge::AbsPathJoin(tmpfile1, \"\")");
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::filesystem::__cxx11::path::~path((path *)&input_buffer);
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = &DAT_00000068;
  file_09.m_begin = (iterator)&local_528;
  msg_08.m_end = (iterator)ppVar7;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_538,
             msg_08);
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_318._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_318._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/fs_tests.cpp";
  local_540 = "";
  input_buffer.field_2._M_allocated_capacity = 0;
  input_buffer.field_2._8_8_ = 0;
  input_buffer._M_dataplus._M_p = (pointer)0x0;
  input_buffer._M_string_length = 0;
  std::filesystem::__cxx11::path::path((path *)&input_buffer);
  fsbridge::AbsPathJoin((path *)&file,&tmpfile1,(path *)&input_buffer);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_328,&local_548,0x68,1,2,&tmpfile1,"tmpfile1",&file,
             "fsbridge::AbsPathJoin(tmpfile1, {})");
  std::filesystem::__cxx11::path::~path((path *)&file);
  std::filesystem::__cxx11::path::~path((path *)&input_buffer);
  std::filesystem::__cxx11::path::~path(&tmpfile2.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfile1.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_fstream)
{
    fs::path tmpfolder = m_args.GetDataDirBase();
    // tmpfile1 should be the same as tmpfile2
    fs::path tmpfile1 = tmpfolder / fs::u8path("fs_tests_₿_🏃");
    fs::path tmpfile2 = tmpfolder / fs::path(u8"fs_tests_₿_🏃");
    {
        std::ofstream file{tmpfile1};
        file << "bitcoin";
    }
    {
        std::ifstream file{tmpfile2};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcoin");
    }
    {
        std::ifstream file{tmpfile1, std::ios_base::in | std::ios_base::ate};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "");
    }
    {
        std::ofstream file{tmpfile2, std::ios_base::out | std::ios_base::app};
        file << "tests";
    }
    {
        std::ifstream file{tmpfile1};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcointests");
    }
    {
        std::ofstream file{tmpfile2, std::ios_base::out | std::ios_base::trunc};
        file << "bitcoin";
    }
    {
        std::ifstream file{tmpfile1};
        std::string input_buffer;
        file >> input_buffer;
        BOOST_CHECK_EQUAL(input_buffer, "bitcoin");
    }
    {
        // Join an absolute path and a relative path.
        fs::path p = fsbridge::AbsPathJoin(tmpfolder, fs::u8path("fs_tests_₿_🏃"));
        BOOST_CHECK(p.is_absolute());
        BOOST_CHECK_EQUAL(tmpfile1, p);
    }
    {
        // Join two absolute paths.
        fs::path p = fsbridge::AbsPathJoin(tmpfile1, tmpfile2);
        BOOST_CHECK(p.is_absolute());
        BOOST_CHECK_EQUAL(tmpfile2, p);
    }
    {
        // Ensure joining with empty paths does not add trailing path components.
        BOOST_CHECK_EQUAL(tmpfile1, fsbridge::AbsPathJoin(tmpfile1, ""));
        BOOST_CHECK_EQUAL(tmpfile1, fsbridge::AbsPathJoin(tmpfile1, {}));
    }
}